

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

int __thiscall
TPZFMatrix<long_double>::Substitution(TPZFMatrix<long_double> *this,TPZFMatrix<long_double> *B)

{
  _func_int **pp_Var1;
  bool bVar2;
  ulong uVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  long lVar7;
  long lVar8;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  double __x;
  double __x_00;
  longdouble diff;
  int64_t col_1;
  int64_t col;
  int64_t j;
  int64_t i;
  int64_t row;
  int64_t colb;
  int64_t rowb;
  char *in_stack_00000148;
  char *in_stack_00000150;
  undefined6 in_stack_ffffffffffffff92;
  undefined2 uVar11;
  undefined6 uStack_66;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  
  if (in_RDI->fDecomposed != '\x01') {
    Error(in_stack_00000150,in_stack_00000148);
  }
  uVar3 = TPZBaseMatrix::Rows(in_RSI);
  iVar4 = TPZBaseMatrix::Cols(in_RSI);
  iVar5 = TPZBaseMatrix::Rows(in_RDI);
  uVar11 = (undefined2)uVar3;
  uStack_66 = (undefined6)(uVar3 >> 0x10);
  iVar6 = TPZBaseMatrix::Rows(in_RDI);
  if (CONCAT62(uStack_66,uVar11) != iVar6) {
    Error(in_stack_00000150,in_stack_00000148);
  }
  for (local_30 = 0; (long)local_30 < (long)uVar3; local_30 = local_30 + 1) {
    for (local_40 = 0; (long)local_40 < iVar4; local_40 = local_40 + 1) {
      for (local_38 = 0; (long)local_38 < (long)local_30; local_38 = local_38 + 1) {
        pp_Var1 = in_RSI[1].super_TPZSavable._vptr_TPZSavable;
        lVar8 = (local_40 & 0xffffffff) * uVar3;
        lVar7 = lVar8 + local_30;
        *(longdouble *)(pp_Var1 + lVar7 * 2) =
             *(longdouble *)(pp_Var1 + lVar7 * 2) -
             *(longdouble *)(pp_Var1 + (lVar8 + local_38) * 2) *
             *(longdouble *)
              (in_RDI[1].super_TPZSavable._vptr_TPZSavable +
              ((local_38 & 0xffffffff) * iVar5 + local_30) * 2);
        in_ST5 = in_ST4;
        in_ST6 = in_ST4;
      }
    }
  }
  for (local_48 = 0; local_38 = uVar3, (long)local_48 < iVar4; local_48 = local_48 + 1) {
    while (local_30 = local_38 - 1, lVar9 = in_ST5, -1 < (long)local_30) {
      for (; (long)local_38 < (long)uVar3; local_38 = local_38 + 1) {
        pp_Var1 = in_RSI[1].super_TPZSavable._vptr_TPZSavable;
        lVar8 = (local_48 & 0xffffffff) * uVar3;
        lVar7 = lVar8 + local_30;
        *(longdouble *)(pp_Var1 + lVar7 * 2) =
             *(longdouble *)(pp_Var1 + lVar7 * 2) -
             *(longdouble *)(pp_Var1 + (lVar8 + local_38) * 2) *
             *(longdouble *)
              (in_RDI[1].super_TPZSavable._vptr_TPZSavable +
              ((local_38 & 0xffffffff) * iVar5 + local_30) * 2);
        lVar9 = in_ST4;
        in_ST6 = in_ST4;
      }
      bVar2 = IsZero((longdouble)
                     CONCAT28(uVar11,CONCAT62(in_stack_ffffffffffffff92,
                                              (short)((unkuint10)
                                                      *(unkbyte10 *)
                                                       (in_RDI[1].super_TPZSavable._vptr_TPZSavable
                                                       + ((local_30 & 0xffffffff) * iVar5 + local_30
                                                         ) * 2) >> 0x40))));
      lVar10 = in_ST3;
      in_ST5 = lVar9;
      if (bVar2) {
        __x_00 = std::fabs(__x);
        if (in_ST0 <= (longdouble)0) {
          Error(in_stack_00000150,in_stack_00000148);
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          lVar10 = in_ST4;
          in_ST4 = lVar9;
          in_ST5 = in_ST6;
        }
        else {
          in_ST0 = in_ST2;
          in_ST2 = in_ST4;
          in_ST4 = in_ST6;
          std::fabs(__x_00);
          bVar2 = (longdouble)1e-12 < in_ST1;
          in_ST1 = in_ST3;
          lVar10 = lVar9;
          in_ST5 = in_ST6;
          if (bVar2) {
            Error(in_stack_00000150,in_stack_00000148);
            in_ST1 = in_ST3;
            lVar10 = lVar9;
            in_ST5 = in_ST6;
          }
        }
      }
      pp_Var1 = in_RSI[1].super_TPZSavable._vptr_TPZSavable;
      lVar7 = (local_48 & 0xffffffff) * uVar3 + local_30;
      *(longdouble *)(pp_Var1 + lVar7 * 2) =
           *(longdouble *)(pp_Var1 + lVar7 * 2) /
           *(longdouble *)
            (in_RDI[1].super_TPZSavable._vptr_TPZSavable +
            ((local_30 & 0xffffffff) * iVar5 + local_30) * 2);
      in_ST3 = lVar10;
      in_ST6 = in_ST5;
      local_38 = local_30;
    }
  }
  return 1;
}

Assistant:

int TPZFMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B ) const {
#ifdef USING_LAPACK    
	if (this->fDecomposed != ELUPivot) {
		Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix");
	}
#else
	if(this->fDecomposed != ELU) {
        Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix");
    }
#endif
    int64_t rowb = B->Rows();
    int64_t colb = B->Cols();
    int64_t row = this->Rows();
    if ( rowb != this->Rows() ) Error( "SubstitutionLU <incompatible dimensions>" );
    
    
    int64_t i,j;
    for ( i = 0; i < rowb; i++ ) {
        for ( int64_t col = 0; col < colb; col++ )
            for (j = 0; j < i; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - GETVAL(this, row, i, j) * GETVAL(B, rowb, j, col));
    }
    
    for (int64_t col=0; col<colb; col++){
        for ( i = rowb-1; i >= 0; i-- ) {
            for (j = i+1; j < rowb ; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - GETVAL(this, row, i, j) * GETVAL(B, rowb, j, col));
            if ( IsZero( GETVAL(this, row, i, i)/*GetVal(i, i)*/ ) ) {
                if (fabs(GETVAL(this, row, i, i)/*GetVal(i, i)*/) > 0.){
                    TVar diff = GETVAL(B, rowb, i, col) - GETVAL(this, row, i, i)/*B->GetVal(i, col) - GetVal(i, i)*/;
                    if (fabs(diff) > 1e-12){
                        Error( "BackSub(SubstitutionLU) <Matrix is singular even after Power Plus..." );
                    }
                }else  Error( "BackSub(SubstitutionLU) <Matrix is singular" );
            }
            PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col)/GETVAL(this, row, i, i));
            //B->PutVal( i, col, B->GetVal( i, col) / GetVal(i, i) );
        }
    }
    return( 1 );
    
}